

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

int __thiscall QTextCursorPrivate::remove(QTextCursorPrivate *this,char *__filename)

{
  bool bVar1;
  QTextTable *pQVar2;
  long in_FS_OFFSET;
  QTextTable *table;
  Operation op;
  int pos2;
  int pos1;
  int numCols;
  int numRows;
  int startCol;
  int startRow;
  int in_stack_ffffffffffffffd0;
  uint numRows_00;
  int startCol_00;
  uint startRow_00;
  QTextCursorPrivate *table_00;
  undefined4 uVar3;
  undefined4 uVar4;
  QTextCursorPrivate *this_00;
  
  this_00 = *(QTextCursorPrivate **)(in_FS_OFFSET + 0x28);
  if (this->anchor != this->position) {
    this->currentCharFormat = -1;
    startRow_00 = this->position;
    startCol_00 = this->adjusted_anchor;
    bVar1 = startCol_00 < (int)startRow_00;
    if (bVar1) {
      startRow_00 = this->adjusted_anchor;
      startCol_00 = this->position;
    }
    numRows_00 = (uint)bVar1;
    table_00 = this;
    pQVar2 = complexSelectionTable
                       ((QTextCursorPrivate *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffd0));
    if (pQVar2 == (QTextTable *)0x0) {
      QTextDocumentPrivate::remove
                (*(QTextDocumentPrivate **)&((QTextDocumentPrivate *)this)->field_0x8,
                 (char *)(ulong)startRow_00);
      *(int *)&((QTextDocumentPrivate *)this)->field_0x1c =
           *(int *)&((QTextDocumentPrivate *)this)->field_0x18;
      *(int *)&((QTextDocumentPrivate *)this)->field_0x20 =
           *(int *)&((QTextDocumentPrivate *)this)->field_0x18;
    }
    else {
      QTextDocumentPrivate::beginEditBlock
                (*(QTextDocumentPrivate **)&((QTextDocumentPrivate *)this)->field_0x8);
      uVar4 = 0xaaaaaaaa;
      uVar3 = 0xaaaaaaaa;
      selectedTableCells(this_00,(int *)&DAT_aaaaaaaaaaaaaaaa,(int *)&DAT_aaaaaaaaaaaaaaaa,
                         (int *)table_00,(int *)CONCAT44(startRow_00,startCol_00));
      clearCells((QTextCursorPrivate *)CONCAT44(uVar4,uVar3),(QTextTable *)table_00,startRow_00,
                 startCol_00,numRows_00,in_stack_ffffffffffffffd0,(Operation)table);
      *(undefined4 *)&((QTextDocumentPrivate *)this)->field_0x1c =
           *(undefined4 *)&((QTextDocumentPrivate *)this)->field_0x18;
      *(undefined4 *)&((QTextDocumentPrivate *)this)->field_0x20 =
           *(undefined4 *)&((QTextDocumentPrivate *)this)->field_0x18;
      QTextDocumentPrivate::endEditBlock((QTextDocumentPrivate *)this);
    }
  }
  if (*(QTextCursorPrivate **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return (int)*(QTextCursorPrivate **)(in_FS_OFFSET + 0x28);
}

Assistant:

void QTextCursorPrivate::remove()
{
    if (anchor == position)
        return;
    currentCharFormat = -1;
    int pos1 = position;
    int pos2 = adjusted_anchor;
    QTextUndoCommand::Operation op = QTextUndoCommand::KeepCursor;
    if (pos1 > pos2) {
        pos1 = adjusted_anchor;
        pos2 = position;
        op = QTextUndoCommand::MoveCursor;
    }

    // deleting inside table? -> delete only content
    QTextTable *table = complexSelectionTable();
    if (table) {
        priv->beginEditBlock();
        int startRow, startCol, numRows, numCols;
        selectedTableCells(&startRow, &numRows, &startCol, &numCols);
        clearCells(table, startRow, startCol, numRows, numCols, op);
        adjusted_anchor = anchor = position;
        priv->endEditBlock();
    } else {
        priv->remove(pos1, pos2-pos1, op);
        adjusted_anchor = anchor = position;
    }

}